

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

void __thiscall Rml::DataViewIf::DataViewIf(DataViewIf *this,Element *element)

{
  String local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_28,0);
  ::std::__cxx11::string::~string((string *)&local_28);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_003967b8;
  return;
}

Assistant:

DataViewIf::DataViewIf(Element* element) : DataViewCommon(element) {}